

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O1

int newton_min_trust(custom_function *funcpt,custom_gradient *funcgrad,double *xi,int N,double *dx,
                    double fsval,double delta,int method,int MAXITER,int *niter,double eps,
                    double gtol,double stol,double *xf)

{
  int iVar1;
  int iVar2;
  double *f;
  double *array;
  double *xi_00;
  double *x;
  double *H;
  double *L;
  double *ioval;
  ulong uVar3;
  char *__format;
  size_t sVar4;
  double eps2;
  double dVar5;
  double dVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  double dVar9;
  double dVar10;
  double *pdVar11;
  int local_68;
  
  sVar4 = (long)N * 8;
  f = (double *)malloc(sVar4);
  array = (double *)malloc(sVar4);
  xi_00 = (double *)malloc(sVar4);
  x = (double *)malloc(sVar4);
  sVar4 = sVar4 * (long)N;
  H = (double *)malloc(sVar4);
  L = (double *)malloc(sVar4);
  ioval = (double *)malloc(0x40);
  *niter = 0;
  pow(eps,0.3333333333333333);
  if (eps < 0.0) {
    eps2 = sqrt(eps);
  }
  else {
    eps2 = SQRT(eps);
  }
  *ioval = (double)(~-(ulong)(0.0 < delta) & 0xbff0000000000000 |
                   (ulong)delta & -(ulong)(0.0 < delta));
  if (0 < N) {
    uVar3 = 0;
    do {
      xi[uVar3] = dx[uVar3] * xi[uVar3];
      dx[uVar3] = 1.0 / dx[uVar3];
      uVar3 = uVar3 + 1;
    } while ((uint)N != uVar3);
  }
  dVar5 = (*funcpt->funcpt)(xi,N,funcpt->params);
  dVar6 = ABS(dVar5);
  local_68 = 0;
  if (1.79769313486232e+308 <= dVar6) {
    printf("Program Exiting as the function value exceeds the maximum double value");
    local_68 = 0xf;
  }
  if (NAN(dVar5)) {
    printf("Program Exiting as the function returns NaN");
    local_68 = 0xf;
  }
  iVar1 = grad_fd(funcpt,funcgrad,xi,N,dx,eps2,f);
  if (iVar1 == 0xf) {
    local_68 = 0xf;
  }
  dVar10 = 0.0;
  dVar5 = 0.0;
  if (0 < N) {
    uVar3 = 0;
    do {
      dVar9 = dx[uVar3];
      dVar5 = dVar5 + dVar9 * dVar9;
      dVar10 = dVar10 + dVar9 * xi[uVar3] * dVar9 * xi[uVar3];
      uVar3 = uVar3 + 1;
    } while ((uint)N != uVar3);
  }
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  if (0 < N) {
    if (dVar6 <= ABS(fsval)) {
      dVar6 = ABS(fsval);
    }
    uVar3 = 0;
    do {
      dVar9 = ABS(xi[uVar3]);
      if (ABS(xi[uVar3]) <= 1.0 / ABS(dx[uVar3])) {
        dVar9 = 1.0 / ABS(dx[uVar3]);
      }
      array[uVar3] = (ABS(f[uVar3]) * dVar9) / dVar6;
      uVar3 = uVar3 + 1;
    } while ((uint)N != uVar3);
  }
  dVar6 = array_max_abs(array,N);
  if (dVar6 <= gtol * 0.001) {
    if (N < 1) {
      local_68 = 1;
    }
    else {
      local_68 = 1;
      uVar3 = 0;
      do {
        xf[uVar3] = xi[uVar3];
        uVar3 = uVar3 + 1;
      } while ((uint)N != uVar3);
    }
  }
  pdVar11 = H;
  iVar1 = hessian_opt(funcpt,funcgrad,xi,N,f,dx,eps,eps2,H);
  if (iVar1 == 0xf) {
    local_68 = 0xf;
  }
  if (0 < N) {
    memcpy(xi_00,xi,(ulong)(uint)N << 3);
  }
  if (local_68 == 0) {
    uVar7 = SUB84(dVar5,0);
    uVar8 = (undefined4)((ulong)dVar5 >> 0x20);
    if (dVar5 <= dVar10) {
      uVar7 = SUB84(dVar10,0);
      uVar8 = (undefined4)((ulong)dVar10 >> 0x20);
    }
    dVar6 = (double)CONCAT44(uVar8,uVar7) * 1000.0;
    do {
      iVar1 = (int)pdVar11;
      if (MAXITER <= *niter) {
        local_68 = 0;
        break;
      }
      *niter = *niter + 1;
      modelhess(H,N,dx,eps,L);
      scale(f,1,N,-1.0);
      linsolve_lower(L,N,f,x);
      scale(f,1,N,-1.0);
      if (method == 1) {
        iVar1 = trsrch_ddl(funcpt,xi_00,f,x,N,dx,dVar6,iVar1,L,H,stol,ioval,xf);
      }
      else {
        if (method != 0) {
          puts("The program accepts only two method values ");
          puts("Method 0 : Hook step ");
          puts("Method 1 : Double Dog Leg Step ");
          exit(1);
        }
        iVar1 = trsrch(funcpt,xi_00,f,x,N,dx,dVar6,*niter,L,H,stol,ioval,eps,xf);
      }
      dVar5 = (*funcpt->funcpt)(xf,N,funcpt->params);
      if (1.79769313486232e+308 <= ABS(dVar5)) {
        __format = "Program Exiting as the function value exceeds the maximum double value";
LAB_00127dad:
        printf(__format);
        local_68 = 0xf;
        break;
      }
      if (NAN(dVar5)) {
        __format = "Program Exiting as the function returns NaN";
        goto LAB_00127dad;
      }
      iVar2 = grad_fd(funcpt,funcgrad,xf,N,dx,eps2,f);
      if (iVar2 == 0xf) {
        local_68 = 0xf;
        break;
      }
      local_68 = stopcheck(dVar5,N,xi_00,xf,f,dx,fsval,gtol,stol,iVar1);
      pdVar11 = H;
      iVar1 = hessian_opt(funcpt,funcgrad,xf,N,f,dx,eps,eps2,H);
      if (iVar1 == 0xf) {
        local_68 = 0xf;
      }
      if (0 < N) {
        memcpy(xi_00,xf,(ulong)(uint)N << 3);
      }
    } while (local_68 == 0);
  }
  if (local_68 == 0) {
    local_68 = (uint)(MAXITER <= *niter) << 2;
  }
  if (0 < N) {
    uVar3 = 0;
    do {
      xi[uVar3] = dx[uVar3] * xi[uVar3];
      dx[uVar3] = 1.0 / dx[uVar3];
      uVar3 = uVar3 + 1;
    } while ((uint)N != uVar3);
  }
  free(ioval);
  free(f);
  free(H);
  free(array);
  free(xi_00);
  free(L);
  free(x);
  return local_68;
}

Assistant:

int newton_min_trust(custom_function *funcpt, custom_gradient *funcgrad, double *xi, int N, double *dx, double fsval, double delta,
		int method,int MAXITER,int *niter,double eps,double gtol,double stol,double *xf) {
	int rcode,iter,gfdcode,hdcode;
	int i,siter,retval,fdiff;
	double dt1,dt2,eps2,eps3;
	double fx,num,den,stop0,maxstep,fxf;
	double *jac,*hess,*scheck,*xc,*L,*step;
	double *ioval;
	
	jac = (double*) malloc(sizeof(double) *N);
	scheck = (double*) malloc(sizeof(double) *N);
	xc = (double*) malloc(sizeof(double) *N);
	step = (double*) malloc(sizeof(double) *N);
	hess = (double*) malloc(sizeof(double) *N * N);
	L = (double*) malloc(sizeof(double) *N * N);
	ioval = (double*) malloc(sizeof(double) *8);
	
	/*
	 * Return Codes
	 * 
	 * Codes 1,2,3 denote possible success.
	 * Codes 0 and 4 denote failure.
	 * 
	 * 1 - df(x)/dx <= gtol achieved so xf may be the local minima.
	 * 2 - Distance between the last two steps is less than stol or |xf - xi| <= stol so xf may be the local minima.
	 * 3 - Global Step failed to locate a lower point than xi so xi may be the local minima.
	 * 4 - Iteration Limit exceeded. Convergence not achieved.
	 * 
	 */ 
	
	rcode = 0;
	*niter = 0;
	siter = MAXITER;
	eps3 = pow(eps,(double) 1.0/3.0);
	eps2 = sqrt(eps);
	gfdcode = 0;
	hdcode = 0;
	//set values
	
	if (delta <= 0.0) {
		delta = -1.0;
	}
	ioval[0] = delta;
	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	fx = FUNCPT_EVAL(funcpt, xi, N);
	if (fx >= DBL_MAX || fx <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		rcode = 15;
	}
	if (fx != fx) {
		printf("Program Exiting as the function returns NaN");
		rcode = 15;
	}
	
	gfdcode = grad_fd(funcpt,funcgrad,xi,N,dx,eps2,jac);
	if (gfdcode == 15) {
		rcode = 15;
	}
	fdiff = 1;
	//grad_cd(funcpt,funcgrad,xi,N,dx,eps3,jac);
	
	maxstep = 1000.0; // Needs to be set at a much higher value proportional to l2 norm of dx
	dt1 = dt2 = 0.0;
	for(i = 0; i < N;++i) {
		dt1 += dx[i] * dx[i];
		dt2 += dx[i] * xi[i] * dx[i] * xi[i];
	}

	dt1 = sqrt(dt1);
	dt2 = sqrt(dt2);
	
	if (dt1 > dt2) {
		maxstep *= dt1;
	} else {
		maxstep *= dt2;
	}
	

	//Check Stop0
	if (fabs(fx) > fabs(fsval)) {
			den = fabs(fx);
	} else {
			den = fabs(fsval);
	}
	for(i = 0; i < N;++i) {
		if (fabs(xi[i]) > 1.0 / fabs(dx[i])) {
			num = fabs(xi[i]);
		} else {
			num = 1.0 / fabs(dx[i]);
		}
		scheck[i] = fabs(jac[i]) * num / den;
	}
	
	stop0 = array_max_abs(scheck,N);
	
	if (stop0 <= gtol * 1e-03) {
		rcode = 1;
		for(i = 0; i < N;++i) {
			xf[i] = xi[i];
		}
		
	}
	
	//hessian_fd(funcpt,xi,N,dx,eps,hess);
	hdcode = hessian_opt(funcpt,funcgrad,xi,N,jac,dx,eps,eps2,hess);
	if (hdcode == 15) {
		rcode = 15;
	}
	
	for(i = 0; i < N;++i) {
		xc[i] = xi[i];
	}
	
	while (rcode == 0 && *niter < siter) {
		*niter = *niter + 1;
		
		modelhess(hess,N,dx,eps,L);
		scale(jac,1,N,-1.0);
		
		linsolve_lower(L,N,jac,step);
		
		scale(jac,1,N,-1.0);
		iter = *niter;
		if (method == 0) {
			retval = trsrch(funcpt,xc,jac,step,N,dx,maxstep,iter,L,hess,stol,ioval,eps,xf);
		} else if (method == 1) {
			retval = trsrch_ddl(funcpt,xc,jac,step,N,dx,maxstep,iter,L,hess,stol,ioval,xf);
		}
		else {
			printf("The program accepts only two method values \n");
			printf("Method 0 : Hook step \n");
			printf("Method 1 : Double Dog Leg Step \n");
			exit(1);
		}
		
		fxf = FUNCPT_EVAL(funcpt, xf, N);
		if (fxf >= DBL_MAX || fxf <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			rcode = 15;
			break;
		}
		if (fxf != fxf) {
			printf("Program Exiting as the function returns NaN");
			rcode = 15;
			break;
		}

		gfdcode = grad_fd(funcpt,funcgrad,xf,N,dx,eps2,jac);
		if (gfdcode == 15) {
			rcode = 15;
			break;
		}
		//grad_cd(funcpt,funcgrad,xf,N,dx,eps3,jac);
		rcode = stopcheck(fxf,N,xc,xf,jac,dx,fsval,gtol,stol,retval);
		//hessian_fd(funcpt,xf,N,dx,eps,hess);
		hdcode = hessian_opt(funcpt,funcgrad,xf,N,jac,dx,eps,eps2,hess);
		if (hdcode == 15) {
			rcode = 15;
		}
		for(i = 0; i < N;++i) {
			xc[i] = xf[i];
		}
	}
	
	if (rcode == 0 && *niter >= siter) {
		rcode = 4;
	}
	
	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	
	free(ioval);
	free(jac);
	free(hess);
	free(scheck);
	free(xc);
	free(L);
	free(step);
	return rcode;
}